

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

void eggs::variants::detail::
     _apply<void,CodeGeneratorData::generate()::$_0,eggs::variants::detail::pack<>,eggs::variants::detail::pack<eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,CompiledScmHeader,CustomHeaderOATC>,false,false>const&>>
     ::call<eggs::variants::detail::index<2ul>>
               (anon_class_8_1_8991fb9c *f,
               _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
               *v)

{
  CodeGeneratorData *codegen;
  size_t sVar1;
  BinaryWriter local_38;
  
  codegen = f->this;
  sVar1 = CustomHeaderOATC::compiled_size((CustomHeaderOATC *)v);
  local_38.bytecode._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(sVar1);
  local_38.offset = 0;
  local_38.max_offset = sVar1;
  BinaryWriter::operator=(&codegen->bw,&local_38);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&local_38.bytecode);
  CustomHeaderOATC::generate_code((CustomHeaderOATC *)v,codegen);
  return;
}

Assistant:

static EGGS_CXX11_CONSTEXPR R call(F&& f, Ms... ms, V&& v)
        {
            return _invoke_guard<R>{}(
                detail::forward<F>(f), detail::forward<Ms>(ms)...
              , _apply_get<V, I>{}(v));
        }